

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O1

void __thiscall TxOrphanage::LimitOrphans(TxOrphanage *this,uint max_orphans,FastRandomContext *rng)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  time_point tVar8;
  _Rb_tree_node_base *p_Var9;
  Logger *pLVar10;
  uint64_t uVar11;
  ulong uVar12;
  iterator maybeErase;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  int nErased;
  uint nEvicted;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nEvicted = 0;
  tVar8 = NodeClock::now();
  lVar2 = (long)tVar8.__d.__r / 1000000000;
  if ((this->m_next_sweep).__d.__r <= lVar2) {
    nErased = 0;
    p_Var3 = (_Base_ptr)(lVar2 + 900);
    p_Var4 = (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(this->m_orphans)._M_t._M_impl.super__Rb_tree_header) {
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      p_Var1 = p_Var4[2]._M_right;
      if (lVar2 < (long)p_Var1) {
        p_Var4 = p_Var9;
        if ((long)p_Var1 <= (long)p_Var3) {
          p_Var3 = p_Var1;
        }
      }
      else {
        iVar6 = EraseTx(this,(Wtxid *)(*(long *)(p_Var4 + 2) + 0x59));
        nErased = nErased + iVar6;
        p_Var4 = p_Var9;
      }
    }
    (this->m_next_sweep).__d.__r = (rep)((long)&p_Var3[9]._M_parent + 4);
    if (0 < nErased) {
      pLVar10 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar10,TXPACKAGES,Debug);
      if (bVar5) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
        ;
        source_file._M_len = 0x5f;
        logging_function._M_str = "LimitOrphans";
        logging_function._M_len = 0xc;
        LogPrintFormatInternal<int>
                  (logging_function,source_file,0x78,TXPACKAGES,Debug,
                   (ConstevalFormatString<1U>)0xfd2a86,&nErased);
      }
    }
  }
  while ((ulong)max_orphans < (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    uVar12 = ((long)(this->m_orphan_list).
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_orphan_list).
                    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
    if (uVar12 == 0) {
      uVar7 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar7 = (uint)lVar2 ^ 0x3f;
    }
    do {
      uVar11 = RandomMixin<FastRandomContext>::randbits
                         (&rng->super_RandomMixin<FastRandomContext>,0x40 - uVar7);
    } while (uVar12 < uVar11);
    EraseTx(this,(Wtxid *)(*(long *)((this->m_orphan_list).
                                     super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node + 2)
                          + 0x59));
    nEvicted = nEvicted + 1;
  }
  if (nEvicted != 0) {
    pLVar10 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar10,TXPACKAGES,Debug);
    if (bVar5) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file_00._M_len = 0x5f;
      logging_function_00._M_str = "LimitOrphans";
      logging_function_00._M_len = 0xc;
      LogPrintFormatInternal<unsigned_int>
                (logging_function_00,source_file_00,0x81,TXPACKAGES,Debug,
                 (ConstevalFormatString<1U>)0xfd2aad,&nEvicted);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::LimitOrphans(unsigned int max_orphans, FastRandomContext& rng)
{
    unsigned int nEvicted = 0;
    auto nNow{Now<NodeSeconds>()};
    if (m_next_sweep <= nNow) {
        // Sweep out expired orphan pool entries:
        int nErased = 0;
        auto nMinExpTime{nNow + ORPHAN_TX_EXPIRE_TIME - ORPHAN_TX_EXPIRE_INTERVAL};
        std::map<Wtxid, OrphanTx>::iterator iter = m_orphans.begin();
        while (iter != m_orphans.end())
        {
            std::map<Wtxid, OrphanTx>::iterator maybeErase = iter++;
            if (maybeErase->second.nTimeExpire <= nNow) {
                nErased += EraseTx(maybeErase->second.tx->GetWitnessHash());
            } else {
                nMinExpTime = std::min(maybeErase->second.nTimeExpire, nMinExpTime);
            }
        }
        // Sweep again 5 minutes after the next entry that expires in order to batch the linear scan.
        m_next_sweep = nMinExpTime + ORPHAN_TX_EXPIRE_INTERVAL;
        if (nErased > 0) LogDebug(BCLog::TXPACKAGES, "Erased %d orphan tx due to expiration\n", nErased);
    }
    while (m_orphans.size() > max_orphans)
    {
        // Evict a random orphan:
        size_t randompos = rng.randrange(m_orphan_list.size());
        EraseTx(m_orphan_list[randompos]->second.tx->GetWitnessHash());
        ++nEvicted;
    }
    if (nEvicted > 0) LogDebug(BCLog::TXPACKAGES, "orphanage overflow, removed %u tx\n", nEvicted);
}